

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  exception *e;
  undefined1 local_1d8 [8];
  application application;
  int return_value;
  char **argv_local;
  int argc_local;
  
  std::operator<<((ostream *)&std::cout,"Autonomous Cabs Backend\n");
  application._command_buffer.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_
       = 0;
  ::application::application((application *)local_1d8);
  application._command_buffer.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_
       = ::application::run((application *)local_1d8,argc,argv);
  ::application::~application((application *)local_1d8);
  return application._command_buffer.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl
         ._20_4_;
}

Assistant:

int main(int argc, char** argv)
{
    std::cout << "Autonomous Cabs Backend\n";

    int return_value = 0;

    try
    {
        application application;
        return_value = application.run(argc, argv);
    }
    catch(std::exception& e)
    {
        std::cerr << "Critital error\n" << e.what() << std::endl;
        std::cerr << "Program terminated" << std::endl;

        return_value = -1;
    }

    return return_value;
}